

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong helper_modsub_mips64(target_ulong rs,target_ulong rt)

{
  undefined8 local_28;
  target_ulong rd;
  uint16_t lastindex;
  int32_t decr;
  target_ulong rt_local;
  target_ulong rs_local;
  
  if ((rs & 0xffffffff) == 0) {
    local_28 = rt >> 8 & 0xffff;
  }
  else {
    local_28 = rs - (long)(int)((uint)rt & 0xff);
  }
  return local_28;
}

Assistant:

target_ulong helper_modsub(target_ulong rs, target_ulong rt)
{
    int32_t decr;
    uint16_t lastindex;
    target_ulong rd;

    decr = rt & MIPSDSP_Q0;
    lastindex = (rt >> 8) & MIPSDSP_LO;

    if ((rs & MIPSDSP_LLO) == 0x00000000) {
        rd = (target_ulong)lastindex;
    } else {
        rd = rs - decr;
    }

    return rd;
}